

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O0

int acmod_set_insenfh(acmod_t *acmod,FILE *senfh)

{
  int iVar1;
  FILE *senfh_local;
  acmod_t *acmod_local;
  
  acmod->insenfh = senfh;
  if (senfh == (FILE *)0x0) {
    acmod->n_feat_frame = 0;
    iVar1 = ps_config_bool(acmod->config,"compallsen");
    acmod->compallsen = (uint8)iVar1;
    acmod_local._4_4_ = 0;
  }
  else {
    acmod->compallsen = '\x01';
    acmod_local._4_4_ = acmod_read_senfh_header(acmod);
  }
  return acmod_local._4_4_;
}

Assistant:

int
acmod_set_insenfh(acmod_t *acmod, FILE *senfh)
{
    acmod->insenfh = senfh;
    if (senfh == NULL) {
        acmod->n_feat_frame = 0;
        acmod->compallsen = ps_config_bool(acmod->config, "compallsen");
        return 0;
    }
    acmod->compallsen = TRUE;
    return acmod_read_senfh_header(acmod);
}